

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  byte bVar1;
  ushort uVar2;
  stbi__uint32 sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  undefined8 uVar8;
  stbi_uc sVar9;
  byte bVar10;
  uchar uVar11;
  char cVar12;
  stbi__uint16 sVar13;
  int iVar14;
  uint uVar15;
  stbi__uint32 sVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  void *pvVar26;
  stbi__context *data;
  stbi__uint16 *psVar27;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar28;
  byte *pbVar29;
  uchar *puVar30;
  uint uVar31;
  char *pcVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  undefined4 in_register_00000084;
  stbi_uc *two_back;
  stbi__result_info *ri_00;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  stbi__uint16 *psVar40;
  stbi__uint16 *psVar41;
  long *in_FS_OFFSET;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar123 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  int iVar153;
  int iVar157;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  stbi_uc pal [256] [4];
  stbi__uint16 *local_8990;
  stbi__uint16 *local_8938;
  stbi__bmp_data local_88dc;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  two_back = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  iVar14 = stbi__check_png_header(s);
  psVar28 = s->img_buffer_original;
  s->img_buffer = psVar28;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar14 != 0) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar14 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      psVar27 = (stbi__uint16 *)local_88a8.history;
      uVar8 = local_88a8._0_8_;
      if (iVar14 == 0) {
        psVar27 = (stbi__uint16 *)0x0;
      }
      else {
        iVar14 = 8;
        if ((8 < local_88a8.flags) && (iVar14 = 0x10, local_88a8.flags != 0x10)) {
          lVar33 = *in_FS_OFFSET;
          pcVar32 = "bad bits_per_channel";
          goto LAB_00138cad;
        }
        ri->bits_per_channel = iVar14;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar14 = *(int *)(local_88a8._0_8_ + 0xc), iVar14 != req_comp)) {
          if (local_88a8.flags < 9) {
            psVar27 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)psVar27,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            psVar27 = stbi__convert_format16
                                (psVar27,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar8 + 0xc) = req_comp;
          if (psVar27 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(local_88a8._0_8_ + 8);
        }
      }
      free(local_88a8.history);
      local_88a8.history = (stbi_uc *)0x0;
      free(local_88a8.background);
      local_88a8.background = (stbi_uc *)0x0;
      free(local_88a8.out);
      return psVar27;
    }
    lVar33 = *in_FS_OFFSET;
    pcVar32 = "bad req_comp";
    goto LAB_00138cad;
  }
  if (psVar28 < s->img_buffer_original_end) {
LAB_00138ce8:
    s->img_buffer = psVar28 + 1;
    if (*psVar28 != 'B') goto LAB_00138e50;
    psVar28 = s->img_buffer;
    if (s->img_buffer_end <= psVar28) {
      if (s->read_from_callbacks == 0) goto LAB_00138e50;
      stbi__refill_buffer(s);
      psVar28 = s->img_buffer;
    }
    s->img_buffer = psVar28 + 1;
    if (*psVar28 != 'M') goto LAB_00138e50;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar15 = stbi__get16le(s);
    iVar14 = stbi__get16le(s);
    uVar15 = iVar14 << 0x10 | uVar15;
    if ((((0x38 < uVar15) || ((0x100010000001000U >> ((ulong)uVar15 & 0x3f) & 1) == 0)) &&
        (uVar15 != 0x7c)) && (uVar15 != 0x6c)) goto LAB_00138e50;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    local_88dc.all_a = 0xff;
    pvVar26 = stbi__bmp_parse_header(s,&local_88dc);
    local_8938._0_4_ = local_88dc.all_a;
    if (pvVar26 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar15 = s->img_y;
    uVar36 = -uVar15;
    if (0 < (int)uVar15) {
      uVar36 = uVar15;
    }
    s->img_y = uVar36;
    if ((uVar36 < 0x1000001) && (s->img_x < 0x1000001)) {
      if (local_88dc.hsz == 0xc) {
        if (local_88dc.bpp < 0x18) {
          uVar35 = (ulong)(uint)(((local_88dc.offset - local_88dc.extra_read) + -0x18) / 3);
        }
        else {
LAB_0013932e:
          uVar35 = 0;
        }
      }
      else {
        if (0xf < local_88dc.bpp) goto LAB_0013932e;
        uVar35 = (ulong)(uint)(local_88dc.offset - (local_88dc.extra_read + local_88dc.hsz) >> 2);
      }
      iVar14 = (int)uVar35;
      if (iVar14 == 0) {
        iVar19 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar19 - 0x401U < 0xfffffc00) {
          lVar33 = *in_FS_OFFSET;
          pcVar32 = "bad header";
          goto LAB_00138cad;
        }
        if ((local_88dc.offset < iVar19) || (0x400 < local_88dc.offset - iVar19)) {
          lVar33 = *in_FS_OFFSET;
          pcVar32 = "bad offset";
          goto LAB_00138cad;
        }
        stbi__skip(s,local_88dc.offset - iVar19);
      }
      uVar36 = local_88dc.ma ^ 0xff000000;
      s->img_n = 4 - (uint)(local_88dc.ma == 0 || local_88dc.bpp == 0x18 && uVar36 == 0);
      iVar19 = req_comp;
      if (req_comp < 3) {
        iVar19 = s->img_n;
      }
      sVar16 = s->img_x;
      sVar3 = s->img_y;
      iVar18 = stbi__mad3sizes_valid(iVar19,sVar16,sVar3,0);
      if (iVar18 == 0) goto LAB_00139958;
      data_00 = (uchar *)stbi__malloc_mad3(iVar19,sVar16,sVar3,0);
      if (data_00 != (uchar *)0x0) {
        if (local_88dc.bpp < 0x10) {
          if (iVar14 < 0x101 && iVar14 != 0) {
            if (0 < iVar14) {
              uVar39 = 0;
              do {
                psVar28 = s->img_buffer;
                if (psVar28 < s->img_buffer_end) {
LAB_001395fe:
                  s->img_buffer = psVar28 + 1;
                  sVar9 = *psVar28;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar28 = s->img_buffer;
                    goto LAB_001395fe;
                  }
                  sVar9 = '\0';
                }
                local_88a8.pal[uVar39 - 0xd][2] = sVar9;
                psVar28 = s->img_buffer;
                if (psVar28 < s->img_buffer_end) {
LAB_0013963d:
                  s->img_buffer = psVar28 + 1;
                  sVar9 = *psVar28;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar28 = s->img_buffer;
                    goto LAB_0013963d;
                  }
                  sVar9 = '\0';
                }
                local_88a8.pal[uVar39 - 0xd][1] = sVar9;
                psVar28 = s->img_buffer;
                if (psVar28 < s->img_buffer_end) {
LAB_00139678:
                  s->img_buffer = psVar28 + 1;
                  sVar9 = *psVar28;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar28 = s->img_buffer;
                    goto LAB_00139678;
                  }
                  sVar9 = '\0';
                }
                local_88a8.pal[uVar39 - 0xd][0] = sVar9;
                if (local_88dc.hsz != 0xc) {
                  psVar28 = s->img_buffer;
                  if (s->img_buffer_end <= psVar28) {
                    if (s->read_from_callbacks == 0) goto LAB_001396c2;
                    stbi__refill_buffer(s);
                    psVar28 = s->img_buffer;
                  }
                  s->img_buffer = psVar28 + 1;
                }
LAB_001396c2:
                local_88a8.pal[uVar39 - 0xd][3] = 0xff;
                uVar39 = uVar39 + 1;
              } while (uVar35 != uVar39);
            }
            stbi__skip(s,(iVar14 * (local_88dc.hsz == 0xc | 0xfffffffc) + local_88dc.offset) -
                         (local_88dc.hsz + local_88dc.extra_read));
            if (local_88dc.bpp == 8) {
              uVar36 = s->img_x;
            }
            else if (local_88dc.bpp == 4) {
              uVar36 = s->img_x + 1 >> 1;
            }
            else {
              if (local_88dc.bpp != 1) {
                free(data_00);
                lVar33 = *in_FS_OFFSET;
                pcVar32 = "bad bpp";
                goto LAB_00138cad;
              }
              uVar36 = s->img_x + 7 >> 3;
            }
            if (local_88dc.bpp == 1) {
              if (0 < (int)s->img_y) {
                iVar14 = 0;
                iVar18 = 0;
                do {
                  pbVar29 = s->img_buffer;
                  if (pbVar29 < s->img_buffer_end) {
LAB_001399d5:
                    s->img_buffer = pbVar29 + 1;
                    uVar34 = (uint)*pbVar29;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar29 = s->img_buffer;
                      goto LAB_001399d5;
                    }
                    uVar34 = 0;
                  }
                  uVar31 = 7;
                  sVar16 = 1;
                  do {
                    sVar3 = s->img_x;
                    if ((int)sVar3 <= (int)(sVar16 - 1)) break;
                    uVar35 = (ulong)((uVar34 >> (uVar31 & 0x1f) & 1) != 0);
                    data_00[iVar14] = local_88a8.pal[uVar35 - 0xd][0];
                    data_00[(long)iVar14 + 1] = local_88a8.pal[uVar35 - 0xd][1];
                    data_00[(long)iVar14 + 2] = local_88a8.pal[uVar35 - 0xd][2];
                    iVar20 = iVar14 + 3;
                    if (iVar19 == 4) {
                      data_00[(long)iVar14 + 3] = 0xff;
                      iVar20 = iVar14 + 4;
                    }
                    iVar14 = iVar20;
                    if (sVar16 != sVar3) {
                      if ((int)uVar31 < 1) {
                        pbVar29 = s->img_buffer;
                        if (pbVar29 < s->img_buffer_end) {
LAB_00139a80:
                          s->img_buffer = pbVar29 + 1;
                          uVar34 = (uint)*pbVar29;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar29 = s->img_buffer;
                            goto LAB_00139a80;
                          }
                          uVar34 = 0;
                        }
                        uVar31 = 7;
                      }
                      else {
                        uVar31 = uVar31 - 1;
                      }
                    }
                    bVar43 = sVar16 != sVar3;
                    sVar16 = sVar16 + 1;
                  } while (bVar43);
                  stbi__skip(s,-uVar36 & 3);
                  iVar18 = iVar18 + 1;
                } while (iVar18 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              uVar35 = 0;
              iVar14 = 0;
              do {
                if (0 < (int)s->img_x) {
                  iVar18 = 0;
                  do {
                    iVar20 = (int)uVar35;
                    pbVar29 = s->img_buffer;
                    if (pbVar29 < s->img_buffer_end) {
LAB_00139b30:
                      s->img_buffer = pbVar29 + 1;
                      uVar34 = (uint)*pbVar29;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar29 = s->img_buffer;
                        goto LAB_00139b30;
                      }
                      uVar34 = 0;
                    }
                    uVar31 = uVar34 >> 4;
                    if (local_88dc.bpp != 4) {
                      uVar31 = uVar34;
                    }
                    uVar35 = (ulong)uVar31;
                    uVar34 = uVar34 & 0xf;
                    if (local_88dc.bpp != 4) {
                      uVar34 = 0;
                    }
                    uVar31 = iVar20 + 3;
                    data_00[iVar20] = local_88a8.pal[uVar35 - 0xd][0];
                    data_00[(long)iVar20 + 1] = local_88a8.pal[uVar35 - 0xd][1];
                    data_00[(long)iVar20 + 2] = local_88a8.pal[uVar35 - 0xd][2];
                    if (iVar19 == 4) {
                      uVar31 = iVar20 + 4;
                      data_00[(long)iVar20 + 3] = 0xff;
                    }
                    sVar16 = s->img_x;
                    if (iVar18 + 1U == sVar16) {
LAB_00139c24:
                      uVar35 = (ulong)uVar31;
                    }
                    else {
                      if (local_88dc.bpp == 8) {
                        pbVar29 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar29) {
                          if (s->read_from_callbacks == 0) {
                            uVar34 = 0;
                            goto LAB_00139bea;
                          }
                          stbi__refill_buffer(s);
                          pbVar29 = s->img_buffer;
                        }
                        s->img_buffer = pbVar29 + 1;
                        uVar34 = (uint)*pbVar29;
                      }
LAB_00139bea:
                      lVar33 = (long)(int)uVar31;
                      uVar35 = lVar33 + 3;
                      uVar39 = (ulong)uVar34;
                      data_00[lVar33] = local_88a8.pal[uVar39 - 0xd][0];
                      data_00[lVar33 + 1] = local_88a8.pal[uVar39 - 0xd][1];
                      data_00[lVar33 + 2] = local_88a8.pal[uVar39 - 0xd][2];
                      if (iVar19 == 4) {
                        uVar31 = uVar31 + 4;
                        data_00[lVar33 + 3] = 0xff;
                        goto LAB_00139c24;
                      }
                    }
                  } while ((iVar18 + 1U != sVar16) && (iVar18 = iVar18 + 2, iVar18 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,-uVar36 & 3);
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)s->img_y);
            }
            goto LAB_0013a074;
          }
          free(data_00);
          lVar33 = *in_FS_OFFSET;
          pcVar32 = "invalid";
          goto LAB_00138cad;
        }
        stbi__skip(s,local_88dc.offset - (local_88dc.hsz + local_88dc.extra_read));
        if (local_88dc.bpp == 0x18) {
          iVar14 = -3;
LAB_0013977f:
          uVar34 = iVar14 * s->img_x & 3;
        }
        else {
          uVar34 = 0;
          if (local_88dc.bpp == 0x10) {
            iVar14 = -2;
            goto LAB_0013977f;
          }
        }
        iVar14 = 0;
        if (local_88dc.bpp == 0x18) {
          bVar43 = false;
LAB_001397c1:
          bVar42 = false;
        }
        else {
          if (local_88dc.bpp != 0x20) {
            bVar43 = true;
            goto LAB_001397c1;
          }
          bVar42 = (local_88dc.mr == 0xff0000 && (local_88dc.mg == 0xff00 && local_88dc.mb == 0xff))
                   && uVar36 == 0;
          bVar43 = (local_88dc.mr != 0xff0000 || (local_88dc.mg != 0xff00 || local_88dc.mb != 0xff))
                   || uVar36 != 0;
        }
        iVar18 = 0;
        iVar20 = 0;
        iVar22 = 0;
        uVar36 = 0;
        uVar31 = 0;
        uVar21 = 0;
        uVar23 = 0;
        if (bVar43) {
          if (local_88dc.mb != 0 && (local_88dc.mg != 0 && local_88dc.mr != 0)) {
            iVar14 = stbi__high_bit(local_88dc.mr);
            uVar36 = stbi__bitcount(local_88dc.mr);
            iVar18 = stbi__high_bit(local_88dc.mg);
            uVar31 = stbi__bitcount(local_88dc.mg);
            iVar20 = stbi__high_bit(local_88dc.mb);
            uVar21 = stbi__bitcount(local_88dc.mb);
            iVar22 = stbi__high_bit(local_88dc.ma);
            uVar23 = stbi__bitcount(local_88dc.ma);
            if ((uVar23 < 9 && uVar21 < 9) && (uVar31 < 9 && uVar36 < 9)) {
              iVar14 = iVar14 + -7;
              iVar18 = iVar18 + -7;
              iVar20 = iVar20 + -7;
              iVar22 = iVar22 + -7;
              goto LAB_00139ca1;
            }
          }
          free(data_00);
          *(char **)(*in_FS_OFFSET + -0x20) = "bad masks";
          bVar7 = false;
        }
        else {
LAB_00139ca1:
          bVar7 = true;
          if (0 < (int)s->img_y) {
            iVar157 = 0;
            local_88b0 = (ulong)(uVar21 << 2);
            local_88b8 = (ulong)(uVar23 << 2);
            iVar153 = 0;
            do {
              if (bVar43) {
                if (0 < (int)s->img_x) {
                  iVar38 = 0;
                  do {
                    uVar24 = stbi__get16le(s);
                    if (local_88dc.bpp != 0x10) {
                      iVar25 = stbi__get16le(s);
                      uVar24 = uVar24 | iVar25 << 0x10;
                    }
                    uVar17 = (uVar24 & local_88dc.mr) >> ((byte)iVar14 & 0x1f);
                    if (iVar14 < 0) {
                      uVar17 = (uVar24 & local_88dc.mr) << (-(byte)iVar14 & 0x1f);
                    }
                    uVar5 = (uVar24 & local_88dc.mg) >> ((byte)iVar18 & 0x1f);
                    if (iVar18 < 0) {
                      uVar5 = (uVar24 & local_88dc.mg) << (-(byte)iVar18 & 0x1f);
                    }
                    iVar25 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                     (uVar31 << 2));
                    bVar10 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar31 << 2];
                    uVar6 = (uVar24 & local_88dc.mb) >> ((byte)iVar20 & 0x1f);
                    if (iVar20 < 0) {
                      uVar6 = (uVar24 & local_88dc.mb) << (-(byte)iVar20 & 0x1f);
                    }
                    iVar4 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table + local_88b0
                                    );
                    bVar1 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b0];
                    data_00[iVar157] =
                         (uchar)((int)((uVar17 >> (8U - (char)uVar36 & 0x1f)) *
                                      *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                              (uVar36 << 2))) >>
                                (stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar36 << 2] &
                                0x1f));
                    data_00[(long)iVar157 + 1] =
                         (uchar)((int)((uVar5 >> (8U - (char)uVar31 & 0x1f)) * iVar25) >>
                                (bVar10 & 0x1f));
                    data_00[(long)iVar157 + 2] =
                         (uchar)((int)((uVar6 >> (8U - (char)uVar21 & 0x1f)) * iVar4) >>
                                (bVar1 & 0x1f));
                    if (local_88dc.ma == 0) {
                      uVar24 = 0xff;
                    }
                    else {
                      uVar17 = (uVar24 & local_88dc.ma) >> ((byte)iVar22 & 0x1f);
                      if (iVar22 < 0) {
                        uVar17 = (uVar24 & local_88dc.ma) << (-(byte)iVar22 & 0x1f);
                      }
                      uVar24 = (int)((uVar17 >> (8U - (char)uVar23 & 0x1f)) *
                                    *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                            local_88b8)) >>
                               (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b8] &
                               0x1f);
                    }
                    iVar25 = iVar157 + 3;
                    if (iVar19 == 4) {
                      data_00[(long)iVar157 + 3] = (uchar)uVar24;
                      iVar25 = iVar157 + 4;
                    }
                    iVar157 = iVar25;
                    local_8938._0_4_ = (uint)local_8938 | uVar24;
                    iVar38 = iVar38 + 1;
                  } while (iVar38 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                iVar38 = 0;
                do {
                  puVar30 = s->img_buffer;
                  if (puVar30 < s->img_buffer_end) {
LAB_00139f17:
                    s->img_buffer = puVar30 + 1;
                    uVar11 = *puVar30;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar30 = s->img_buffer;
                      goto LAB_00139f17;
                    }
                    uVar11 = '\0';
                  }
                  data_00[(long)iVar157 + 2] = uVar11;
                  puVar30 = s->img_buffer;
                  if (puVar30 < s->img_buffer_end) {
LAB_00139f5a:
                    s->img_buffer = puVar30 + 1;
                    uVar11 = *puVar30;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar30 = s->img_buffer;
                      goto LAB_00139f5a;
                    }
                    uVar11 = '\0';
                  }
                  data_00[(long)iVar157 + 1] = uVar11;
                  puVar30 = s->img_buffer;
                  if (puVar30 < s->img_buffer_end) {
LAB_00139f9a:
                    s->img_buffer = puVar30 + 1;
                    uVar11 = *puVar30;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar30 = s->img_buffer;
                      goto LAB_00139f9a;
                    }
                    uVar11 = '\0';
                  }
                  data_00[iVar157] = uVar11;
                  bVar10 = 0xff;
                  if (bVar42) {
                    pbVar29 = s->img_buffer;
                    if (s->img_buffer_end <= pbVar29) {
                      if (s->read_from_callbacks == 0) {
                        bVar10 = 0;
                        goto LAB_00139feb;
                      }
                      stbi__refill_buffer(s);
                      pbVar29 = s->img_buffer;
                    }
                    s->img_buffer = pbVar29 + 1;
                    bVar10 = *pbVar29;
                  }
LAB_00139feb:
                  iVar25 = iVar157 + 3;
                  if (iVar19 == 4) {
                    data_00[(long)iVar157 + 3] = bVar10;
                    iVar25 = iVar157 + 4;
                  }
                  iVar157 = iVar25;
                  local_8938._0_4_ = (uint)local_8938 | bVar10;
                  iVar38 = iVar38 + 1;
                } while (iVar38 < (int)s->img_x);
              }
              stbi__skip(s,uVar34);
              iVar153 = iVar153 + 1;
            } while (iVar153 < (int)s->img_y);
            bVar7 = true;
          }
        }
        if (!bVar7) {
          return (void *)0x0;
        }
LAB_0013a074:
        auVar80 = _DAT_0023bc90;
        auVar127 = _DAT_0023bc80;
        auVar76 = _DAT_0023bc70;
        auVar55 = _DAT_0023bc60;
        auVar129 = _DAT_0023bc50;
        auVar46 = _DAT_0023bba0;
        auVar123 = _DAT_0023bb90;
        if (((iVar19 == 4) && ((uint)local_8938 == 0)) &&
           (uVar36 = s->img_x * s->img_y * 4 - 1, -1 < (int)uVar36)) {
          uVar34 = uVar36 >> 2;
          auVar81._4_4_ = 0;
          auVar81._0_4_ = uVar34;
          auVar81._8_4_ = uVar34;
          auVar81._12_4_ = 0;
          puVar30 = data_00 + uVar36;
          uVar35 = 0;
          auVar53._8_4_ = 0xffffffff;
          auVar53._0_8_ = 0xffffffffffffffff;
          auVar53._12_4_ = 0xffffffff;
          do {
            auVar130._8_4_ = (int)uVar35;
            auVar130._0_8_ = uVar35;
            auVar130._12_4_ = (int)(uVar35 >> 0x20);
            auVar132 = auVar81 | auVar46;
            auVar134 = (auVar130 | auVar123) ^ auVar46;
            iVar14 = auVar132._0_4_;
            iVar153 = -(uint)(iVar14 < auVar134._0_4_);
            iVar18 = auVar132._4_4_;
            auVar136._4_4_ = -(uint)(iVar18 < auVar134._4_4_);
            iVar20 = auVar132._8_4_;
            iVar157 = -(uint)(iVar20 < auVar134._8_4_);
            iVar22 = auVar132._12_4_;
            auVar136._12_4_ = -(uint)(iVar22 < auVar134._12_4_);
            auVar146._4_4_ = iVar153;
            auVar146._0_4_ = iVar153;
            auVar146._8_4_ = iVar157;
            auVar146._12_4_ = iVar157;
            auVar132 = pshuflw(in_XMM1,auVar146,0xe8);
            auVar135._4_4_ = -(uint)(auVar134._4_4_ == iVar18);
            auVar135._12_4_ = -(uint)(auVar134._12_4_ == iVar22);
            auVar135._0_4_ = auVar135._4_4_;
            auVar135._8_4_ = auVar135._12_4_;
            auVar58 = pshuflw(in_XMM2,auVar135,0xe8);
            auVar136._0_4_ = auVar136._4_4_;
            auVar136._8_4_ = auVar136._12_4_;
            auVar134 = pshuflw(auVar132,auVar136,0xe8);
            auVar132 = (auVar134 | auVar58 & auVar132) ^ auVar53;
            auVar132 = packssdw(auVar132,auVar132);
            if ((auVar132 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *puVar30 = 0xff;
            }
            auVar136 = auVar135 & auVar146 | auVar136;
            auVar132 = packssdw(auVar136,auVar136);
            auVar132 = packssdw(auVar132 ^ auVar53,auVar132 ^ auVar53);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132._0_4_ >> 8 & 1) != 0) {
              puVar30[-4] = 0xff;
            }
            auVar132 = (auVar130 | auVar80) ^ auVar46;
            auVar134._0_4_ = -(uint)(iVar14 < auVar132._0_4_);
            auVar134._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
            auVar134._8_4_ = -(uint)(iVar20 < auVar132._8_4_);
            auVar134._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
            auVar58._4_4_ = auVar134._0_4_;
            auVar58._0_4_ = auVar134._0_4_;
            auVar58._8_4_ = auVar134._8_4_;
            auVar58._12_4_ = auVar134._8_4_;
            iVar153 = -(uint)(auVar132._4_4_ == iVar18);
            iVar157 = -(uint)(auVar132._12_4_ == iVar22);
            auVar147._4_4_ = iVar153;
            auVar147._0_4_ = iVar153;
            auVar147._8_4_ = iVar157;
            auVar147._12_4_ = iVar157;
            auVar154._4_4_ = auVar134._4_4_;
            auVar154._0_4_ = auVar134._4_4_;
            auVar154._8_4_ = auVar134._12_4_;
            auVar154._12_4_ = auVar134._12_4_;
            auVar132 = auVar147 & auVar58 | auVar154;
            auVar132 = packssdw(auVar132,auVar132);
            auVar132 = packssdw(auVar132 ^ auVar53,auVar132 ^ auVar53);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132._0_4_ >> 0x10 & 1) != 0) {
              puVar30[-8] = 0xff;
            }
            auVar132 = pshufhw(auVar132,auVar58,0x84);
            auVar58 = pshufhw(auVar134,auVar147,0x84);
            auVar134 = pshufhw(auVar132,auVar154,0x84);
            auVar132 = (auVar134 | auVar58 & auVar132) ^ auVar53;
            auVar132 = packssdw(auVar132,auVar132);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132._0_4_ >> 0x18 & 1) != 0) {
              puVar30[-0xc] = 0xff;
            }
            auVar132 = (auVar130 | auVar127) ^ auVar46;
            auVar59._0_4_ = -(uint)(iVar14 < auVar132._0_4_);
            auVar59._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
            auVar59._8_4_ = -(uint)(iVar20 < auVar132._8_4_);
            auVar59._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
            auVar148._4_4_ = auVar59._0_4_;
            auVar148._0_4_ = auVar59._0_4_;
            auVar148._8_4_ = auVar59._8_4_;
            auVar148._12_4_ = auVar59._8_4_;
            auVar58 = pshuflw(auVar154,auVar148,0xe8);
            auVar50._0_4_ = -(uint)(auVar132._0_4_ == iVar14);
            auVar50._4_4_ = -(uint)(auVar132._4_4_ == iVar18);
            auVar50._8_4_ = -(uint)(auVar132._8_4_ == iVar20);
            auVar50._12_4_ = -(uint)(auVar132._12_4_ == iVar22);
            auVar137._4_4_ = auVar50._4_4_;
            auVar137._0_4_ = auVar50._4_4_;
            auVar137._8_4_ = auVar50._12_4_;
            auVar137._12_4_ = auVar50._12_4_;
            auVar132 = pshuflw(auVar50,auVar137,0xe8);
            auVar138._4_4_ = auVar59._4_4_;
            auVar138._0_4_ = auVar59._4_4_;
            auVar138._8_4_ = auVar59._12_4_;
            auVar138._12_4_ = auVar59._12_4_;
            auVar134 = pshuflw(auVar59,auVar138,0xe8);
            auVar132 = packssdw(auVar132 & auVar58,(auVar134 | auVar132 & auVar58) ^ auVar53);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar30[-0x10] = 0xff;
            }
            auVar138 = auVar137 & auVar148 | auVar138;
            auVar134 = packssdw(auVar138,auVar138);
            auVar132 = packssdw(auVar132,auVar134 ^ auVar53);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132._4_2_ >> 8 & 1) != 0) {
              puVar30[-0x14] = 0xff;
            }
            auVar132 = (auVar130 | auVar76) ^ auVar46;
            auVar60._0_4_ = -(uint)(iVar14 < auVar132._0_4_);
            auVar60._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
            auVar60._8_4_ = -(uint)(iVar20 < auVar132._8_4_);
            auVar60._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
            auVar139._4_4_ = auVar60._0_4_;
            auVar139._0_4_ = auVar60._0_4_;
            auVar139._8_4_ = auVar60._8_4_;
            auVar139._12_4_ = auVar60._8_4_;
            iVar153 = -(uint)(auVar132._4_4_ == iVar18);
            iVar157 = -(uint)(auVar132._12_4_ == iVar22);
            auVar149._4_4_ = iVar153;
            auVar149._0_4_ = iVar153;
            auVar149._8_4_ = iVar157;
            auVar149._12_4_ = iVar157;
            auVar155._4_4_ = auVar60._4_4_;
            auVar155._0_4_ = auVar60._4_4_;
            auVar155._8_4_ = auVar60._12_4_;
            auVar155._12_4_ = auVar60._12_4_;
            auVar132 = auVar149 & auVar139 | auVar155;
            auVar132 = packssdw(auVar132,auVar132);
            auVar132 = packssdw(auVar132 ^ auVar53,auVar132 ^ auVar53);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar30[-0x18] = 0xff;
            }
            auVar132 = pshufhw(auVar132,auVar139,0x84);
            auVar58 = pshufhw(auVar60,auVar149,0x84);
            auVar134 = pshufhw(auVar132,auVar155,0x84);
            auVar132 = (auVar134 | auVar58 & auVar132) ^ auVar53;
            auVar132 = packssdw(auVar132,auVar132);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132._6_2_ >> 8 & 1) != 0) {
              puVar30[-0x1c] = 0xff;
            }
            auVar132 = (auVar130 | auVar55) ^ auVar46;
            auVar61._0_4_ = -(uint)(iVar14 < auVar132._0_4_);
            auVar61._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
            auVar61._8_4_ = -(uint)(iVar20 < auVar132._8_4_);
            auVar61._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
            auVar150._4_4_ = auVar61._0_4_;
            auVar150._0_4_ = auVar61._0_4_;
            auVar150._8_4_ = auVar61._8_4_;
            auVar150._12_4_ = auVar61._8_4_;
            auVar58 = pshuflw(auVar155,auVar150,0xe8);
            auVar51._0_4_ = -(uint)(auVar132._0_4_ == iVar14);
            auVar51._4_4_ = -(uint)(auVar132._4_4_ == iVar18);
            auVar51._8_4_ = -(uint)(auVar132._8_4_ == iVar20);
            auVar51._12_4_ = -(uint)(auVar132._12_4_ == iVar22);
            auVar140._4_4_ = auVar51._4_4_;
            auVar140._0_4_ = auVar51._4_4_;
            auVar140._8_4_ = auVar51._12_4_;
            auVar140._12_4_ = auVar51._12_4_;
            auVar132 = pshuflw(auVar51,auVar140,0xe8);
            auVar141._4_4_ = auVar61._4_4_;
            auVar141._0_4_ = auVar61._4_4_;
            auVar141._8_4_ = auVar61._12_4_;
            auVar141._12_4_ = auVar61._12_4_;
            auVar134 = pshuflw(auVar61,auVar141,0xe8);
            auVar134 = (auVar134 | auVar132 & auVar58) ^ auVar53;
            auVar134 = packssdw(auVar134,auVar134);
            auVar132 = packsswb(auVar132 & auVar58,auVar134);
            if ((auVar132 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar30[-0x20] = 0xff;
            }
            auVar141 = auVar140 & auVar150 | auVar141;
            auVar134 = packssdw(auVar141,auVar141);
            auVar134 = packssdw(auVar134 ^ auVar53,auVar134 ^ auVar53);
            auVar132 = packsswb(auVar132,auVar134);
            if ((auVar132._8_2_ >> 8 & 1) != 0) {
              puVar30[-0x24] = 0xff;
            }
            auVar132 = (auVar130 | auVar129) ^ auVar46;
            auVar62._0_4_ = -(uint)(iVar14 < auVar132._0_4_);
            auVar62._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
            auVar62._8_4_ = -(uint)(iVar20 < auVar132._8_4_);
            auVar62._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
            auVar142._4_4_ = auVar62._0_4_;
            auVar142._0_4_ = auVar62._0_4_;
            auVar142._8_4_ = auVar62._8_4_;
            auVar142._12_4_ = auVar62._8_4_;
            iVar153 = -(uint)(auVar132._4_4_ == iVar18);
            iVar157 = -(uint)(auVar132._12_4_ == iVar22);
            auVar151._4_4_ = iVar153;
            auVar151._0_4_ = iVar153;
            auVar151._8_4_ = iVar157;
            auVar151._12_4_ = iVar157;
            auVar156._4_4_ = auVar62._4_4_;
            auVar156._0_4_ = auVar62._4_4_;
            auVar156._8_4_ = auVar62._12_4_;
            auVar156._12_4_ = auVar62._12_4_;
            auVar132 = auVar151 & auVar142 | auVar156;
            auVar132 = packssdw(auVar132,auVar132);
            auVar132 = packssdw(auVar132 ^ auVar53,auVar132 ^ auVar53);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar30[-0x28] = 0xff;
            }
            auVar132 = pshufhw(auVar132,auVar142,0x84);
            auVar58 = pshufhw(auVar62,auVar151,0x84);
            auVar134 = pshufhw(auVar132,auVar156,0x84);
            auVar132 = (auVar134 | auVar58 & auVar132) ^ auVar53;
            auVar132 = packssdw(auVar132,auVar132);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132._10_2_ >> 8 & 1) != 0) {
              puVar30[-0x2c] = 0xff;
            }
            auVar132 = (auVar130 | _DAT_0023bc40) ^ auVar46;
            auVar63._0_4_ = -(uint)(iVar14 < auVar132._0_4_);
            auVar63._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
            auVar63._8_4_ = -(uint)(iVar20 < auVar132._8_4_);
            auVar63._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
            auVar152._4_4_ = auVar63._0_4_;
            auVar152._0_4_ = auVar63._0_4_;
            auVar152._8_4_ = auVar63._8_4_;
            auVar152._12_4_ = auVar63._8_4_;
            auVar58 = pshuflw(auVar156,auVar152,0xe8);
            auVar52._0_4_ = -(uint)(auVar132._0_4_ == iVar14);
            auVar52._4_4_ = -(uint)(auVar132._4_4_ == iVar18);
            auVar52._8_4_ = -(uint)(auVar132._8_4_ == iVar20);
            auVar52._12_4_ = -(uint)(auVar132._12_4_ == iVar22);
            auVar143._4_4_ = auVar52._4_4_;
            auVar143._0_4_ = auVar52._4_4_;
            auVar143._8_4_ = auVar52._12_4_;
            auVar143._12_4_ = auVar52._12_4_;
            auVar132 = pshuflw(auVar52,auVar143,0xe8);
            auVar144._4_4_ = auVar63._4_4_;
            auVar144._0_4_ = auVar63._4_4_;
            auVar144._8_4_ = auVar63._12_4_;
            auVar144._12_4_ = auVar63._12_4_;
            auVar134 = pshuflw(auVar63,auVar144,0xe8);
            auVar132 = packssdw(auVar132 & auVar58,(auVar134 | auVar132 & auVar58) ^ auVar53);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar30[-0x30] = 0xff;
            }
            auVar144 = auVar143 & auVar152 | auVar144;
            auVar134 = packssdw(auVar144,auVar144);
            auVar132 = packssdw(auVar132,auVar134 ^ auVar53);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132._12_2_ >> 8 & 1) != 0) {
              puVar30[-0x34] = 0xff;
            }
            auVar134 = (auVar130 | _DAT_0023bc30) ^ auVar46;
            auVar132._0_4_ = -(uint)(iVar14 < auVar134._0_4_);
            auVar132._4_4_ = -(uint)(iVar18 < auVar134._4_4_);
            auVar132._8_4_ = -(uint)(iVar20 < auVar134._8_4_);
            auVar132._12_4_ = -(uint)(iVar22 < auVar134._12_4_);
            auVar145._4_4_ = auVar132._0_4_;
            auVar145._0_4_ = auVar132._0_4_;
            auVar145._8_4_ = auVar132._8_4_;
            auVar145._12_4_ = auVar132._8_4_;
            auVar131._4_4_ = -(uint)(auVar134._4_4_ == iVar18);
            auVar131._12_4_ = -(uint)(auVar134._12_4_ == iVar22);
            auVar131._0_4_ = auVar131._4_4_;
            auVar131._8_4_ = auVar131._12_4_;
            auVar133._4_4_ = auVar132._4_4_;
            auVar133._0_4_ = auVar132._4_4_;
            auVar133._8_4_ = auVar132._12_4_;
            auVar133._12_4_ = auVar132._12_4_;
            auVar134 = auVar131 & auVar145 | auVar133;
            auVar132 = packssdw(auVar132,auVar134);
            auVar132 = packssdw(auVar132 ^ auVar53,auVar132 ^ auVar53);
            auVar132 = packsswb(auVar132,auVar132);
            if ((auVar132 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar30[-0x38] = 0xff;
            }
            auVar132 = pshufhw(auVar132,auVar145,0x84);
            in_XMM2 = pshufhw(auVar134,auVar131,0x84);
            in_XMM2 = in_XMM2 & auVar132;
            auVar132 = pshufhw(auVar132,auVar133,0x84);
            auVar132 = (auVar132 | in_XMM2) ^ auVar53;
            auVar132 = packssdw(auVar132,auVar132);
            in_XMM1 = packsswb(auVar132,auVar132);
            if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
              puVar30[-0x3c] = 0xff;
            }
            uVar35 = uVar35 + 0x10;
            puVar30 = puVar30 + -0x40;
          } while ((uVar34 + 0x10 & 0x3ffffff0) != uVar35);
        }
        if (0 < (int)uVar15) {
          uVar15 = (int)s->img_y >> 1;
          if (0 < (int)uVar15) {
            uVar34 = s->img_x * iVar19;
            uVar36 = (s->img_y - 1) * uVar34;
            uVar35 = 0;
            uVar39 = 0;
            do {
              if (0 < (int)uVar34) {
                uVar37 = 0;
                do {
                  uVar11 = data_00[uVar37 + uVar35];
                  data_00[uVar37 + uVar35] = data_00[uVar37 + uVar36];
                  data_00[uVar37 + uVar36] = uVar11;
                  uVar37 = uVar37 + 1;
                } while (uVar34 != uVar37);
              }
              uVar39 = uVar39 + 1;
              uVar36 = uVar36 - uVar34;
              uVar35 = (ulong)((int)uVar35 + uVar34);
            } while (uVar39 != uVar15);
          }
        }
        if ((iVar19 != req_comp && req_comp != 0) &&
           (data_00 = stbi__convert_format(data_00,iVar19,req_comp,s->img_x,s->img_y),
           data_00 == (uchar *)0x0)) {
          return (void *)0x0;
        }
        *x = s->img_x;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return data_00;
        }
        return data_00;
      }
LAB_0013accd:
      lVar33 = *in_FS_OFFSET;
      pcVar32 = "outofmem";
      goto LAB_00138cad;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar28 = s->img_buffer;
      goto LAB_00138ce8;
    }
LAB_00138e50:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar14 = stbi__gif_test(s);
    if (iVar14 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,two_back);
      if (data == s) {
        data = (stbi__context *)0x0;
      }
      if (data == (stbi__context *)0x0) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      free(local_88a8.background);
      return data;
    }
    iVar14 = stbi__get16be(s);
    uVar15 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar15 | iVar14 << 0x10) != 0x38425053) {
      iVar14 = stbi__pic_test(s);
      if (iVar14 != 0) {
        pvVar26 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar26;
      }
      iVar14 = stbi__jpeg_test(s);
      if (iVar14 != 0) {
        pvVar26 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar26;
      }
      iVar14 = stbi__pnm_test(s);
      if (iVar14 != 0) {
        pvVar26 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar26;
      }
      iVar14 = stbi__hdr_test(s);
      if (iVar14 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar28 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar28;
      }
      iVar14 = stbi__tga_test(s);
      if (iVar14 != 0) {
        pvVar26 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar26;
      }
      lVar33 = *in_FS_OFFSET;
      pcVar32 = "unknown image type";
      goto LAB_00138cad;
    }
    iVar14 = stbi__get16be(s);
    uVar15 = stbi__get16be(s);
    if ((uVar15 | iVar14 << 0x10) != 0x38425053) {
      lVar33 = *in_FS_OFFSET;
      pcVar32 = "not PSD";
      goto LAB_00138cad;
    }
    iVar14 = stbi__get16be(s);
    if (iVar14 != 1) {
      lVar33 = *in_FS_OFFSET;
      pcVar32 = "wrong version";
      goto LAB_00138cad;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001391b1:
      s->img_buffer = s->img_buffer + 6;
    }
    else {
      iVar14 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (5 < iVar14) goto LAB_001391b1;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar14);
    }
    uVar15 = stbi__get16be(s);
    if (0x10 < uVar15) {
      lVar33 = *in_FS_OFFSET;
      pcVar32 = "wrong channel count";
      goto LAB_00138cad;
    }
    iVar14 = stbi__get16be(s);
    uVar21 = iVar14 * 0x10000;
    uVar36 = stbi__get16be(s);
    uVar31 = uVar21 + uVar36;
    iVar14 = stbi__get16be(s);
    uVar34 = stbi__get16be(s);
    if ((int)uVar31 < 0x1000001) {
      uVar24 = iVar14 * 0x10000;
      uVar23 = uVar24 + uVar34;
      if ((int)uVar23 < 0x1000001) {
        iVar14 = stbi__get16be(s);
        if ((iVar14 != 8) && (iVar14 != 0x10)) {
          lVar33 = *in_FS_OFFSET;
          pcVar32 = "unsupported bit depth";
          goto LAB_00138cad;
        }
        iVar19 = stbi__get16be(s);
        if (iVar19 != 3) {
          lVar33 = *in_FS_OFFSET;
          pcVar32 = "wrong color format";
          goto LAB_00138cad;
        }
        sVar16 = stbi__get32be(s);
        stbi__skip(s,sVar16);
        sVar16 = stbi__get32be(s);
        stbi__skip(s,sVar16);
        sVar16 = stbi__get32be(s);
        stbi__skip(s,sVar16);
        uVar17 = stbi__get16be(s);
        if (1 < uVar17) {
          lVar33 = *in_FS_OFFSET;
          pcVar32 = "bad compression";
          goto LAB_00138cad;
        }
        iVar19 = stbi__mad3sizes_valid(4,uVar23,uVar31,0);
        if (iVar19 != 0) {
          if (((bpc == 0x10) && (iVar14 == 0x10)) && (uVar17 == 0)) {
            psVar27 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar23,uVar31,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            psVar27 = (stbi__uint16 *)malloc((long)(int)(uVar31 * uVar23 * 4));
          }
          if (psVar27 != (stbi__uint16 *)0x0) {
            iVar19 = uVar23 * uVar31;
            if (uVar17 == 0) {
              lVar33 = (ulong)((uVar36 | uVar21) * (uVar34 | uVar24)) - 1;
              auVar46._8_4_ = (int)lVar33;
              auVar46._0_8_ = lVar33;
              auVar46._12_4_ = (int)((ulong)lVar33 >> 0x20);
              psVar40 = psVar27 + 0x1e;
              uVar17 = (uVar36 + uVar21) * (uVar34 + uVar24);
              psVar41 = psVar27 + 0x1c;
              uVar35 = 0;
              auVar129._8_4_ = 0xffffffff;
              auVar129._0_8_ = 0xffffffffffffffff;
              auVar129._12_4_ = 0xffffffff;
              auVar123 = _DAT_0023bba0;
              local_8990 = psVar27;
              local_8938 = psVar27;
              do {
                if (uVar35 < uVar15) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar19) {
                      lVar33 = 0;
                      do {
                        iVar18 = stbi__get16be(s);
                        auVar123 = _DAT_0023bba0;
                        auVar129._8_4_ = 0xffffffff;
                        auVar129._0_8_ = 0xffffffffffffffff;
                        auVar129._12_4_ = 0xffffffff;
                        local_8938[lVar33 * 4] = (stbi__uint16)iVar18;
                        lVar33 = lVar33 + 1;
                      } while (uVar17 != (uint)lVar33);
                    }
                  }
                  else if (iVar14 == 0x10) {
                    if (0 < iVar19) {
                      lVar33 = 0;
                      do {
                        iVar18 = stbi__get16be(s);
                        auVar123 = _DAT_0023bba0;
                        auVar129._8_4_ = 0xffffffff;
                        auVar129._0_8_ = 0xffffffffffffffff;
                        auVar129._12_4_ = 0xffffffff;
                        *(char *)(local_8990 + lVar33 * 2) = (char)((uint)iVar18 >> 8);
                        lVar33 = lVar33 + 1;
                      } while (uVar17 - (int)lVar33 != 0);
                    }
                  }
                  else if (0 < iVar19) {
                    lVar33 = 0;
                    do {
                      psVar28 = s->img_buffer;
                      if (psVar28 < s->img_buffer_end) {
LAB_0013b528:
                        s->img_buffer = psVar28 + 1;
                        sVar9 = *psVar28;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          auVar129._8_4_ = 0xffffffff;
                          auVar129._0_8_ = 0xffffffffffffffff;
                          auVar129._12_4_ = 0xffffffff;
                          psVar28 = s->img_buffer;
                          auVar123 = _DAT_0023bba0;
                          goto LAB_0013b528;
                        }
                        sVar9 = '\0';
                      }
                      *(stbi_uc *)(local_8990 + lVar33 * 2) = sVar9;
                      lVar33 = lVar33 + 1;
                    } while (uVar17 - (int)lVar33 != 0);
                  }
                }
                else if (iVar14 == 0x10 && bpc == 0x10) {
                  if (0 < iVar19) {
                    sVar13 = -(ushort)(uVar35 == 3);
                    uVar39 = 0;
                    do {
                      auVar47._8_4_ = (int)uVar39;
                      auVar47._0_8_ = uVar39;
                      auVar47._12_4_ = (int)(uVar39 >> 0x20);
                      auVar55 = auVar46 ^ auVar123;
                      auVar76 = (auVar47 | _DAT_0023bb90) ^ auVar123;
                      iVar18 = auVar55._0_4_;
                      iVar157 = -(uint)(iVar18 < auVar76._0_4_);
                      iVar20 = auVar55._4_4_;
                      auVar78._4_4_ = -(uint)(iVar20 < auVar76._4_4_);
                      iVar22 = auVar55._8_4_;
                      iVar38 = -(uint)(iVar22 < auVar76._8_4_);
                      iVar153 = auVar55._12_4_;
                      auVar78._12_4_ = -(uint)(iVar153 < auVar76._12_4_);
                      auVar103._4_4_ = iVar157;
                      auVar103._0_4_ = iVar157;
                      auVar103._8_4_ = iVar38;
                      auVar103._12_4_ = iVar38;
                      auVar55 = pshuflw(in_XMM5,auVar103,0xe8);
                      auVar77._4_4_ = -(uint)(auVar76._4_4_ == iVar20);
                      auVar77._12_4_ = -(uint)(auVar76._12_4_ == iVar153);
                      auVar77._0_4_ = auVar77._4_4_;
                      auVar77._8_4_ = auVar77._12_4_;
                      auVar127 = pshuflw(in_XMM6,auVar77,0xe8);
                      auVar78._0_4_ = auVar78._4_4_;
                      auVar78._8_4_ = auVar78._12_4_;
                      auVar76 = pshuflw(auVar55,auVar78,0xe8);
                      auVar76 = (auVar76 | auVar127 & auVar55) ^ auVar129;
                      auVar76 = packssdw(auVar76,auVar76);
                      if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar41[uVar39 * 4 + 0xffffffffffffffe4] = sVar13;
                      }
                      auVar78 = auVar77 & auVar103 | auVar78;
                      auVar76 = packssdw(auVar78,auVar78);
                      auVar76 = packssdw(auVar76 ^ auVar129,auVar76 ^ auVar129);
                      if ((auVar76._0_4_ >> 0x10 & 1) != 0) {
                        psVar41[uVar39 * 4 + 0xffffffffffffffe8] = sVar13;
                      }
                      auVar76 = (auVar47 | _DAT_0023bc90) ^ auVar123;
                      iVar157 = -(uint)(iVar18 < auVar76._0_4_);
                      auVar119._4_4_ = -(uint)(iVar20 < auVar76._4_4_);
                      iVar38 = -(uint)(iVar22 < auVar76._8_4_);
                      auVar119._12_4_ = -(uint)(iVar153 < auVar76._12_4_);
                      auVar79._4_4_ = iVar157;
                      auVar79._0_4_ = iVar157;
                      auVar79._8_4_ = iVar38;
                      auVar79._12_4_ = iVar38;
                      auVar104._4_4_ = -(uint)(auVar76._4_4_ == iVar20);
                      auVar104._12_4_ = -(uint)(auVar76._12_4_ == iVar153);
                      auVar104._0_4_ = auVar104._4_4_;
                      auVar104._8_4_ = auVar104._12_4_;
                      auVar119._0_4_ = auVar119._4_4_;
                      auVar119._8_4_ = auVar119._12_4_;
                      auVar76 = auVar104 & auVar79 | auVar119;
                      auVar76 = packssdw(auVar76,auVar76);
                      auVar76 = packssdw(auVar76 ^ auVar129,auVar76 ^ auVar129);
                      if ((auVar76 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar41[uVar39 * 4 + 0xffffffffffffffec] = sVar13;
                      }
                      auVar80 = pshufhw(auVar79,auVar79,0x84);
                      auVar53 = pshufhw(auVar104,auVar104,0x84);
                      auVar81 = pshufhw(auVar80,auVar119,0x84);
                      auVar80 = (auVar81 | auVar53 & auVar80) ^ auVar129;
                      auVar80 = packssdw(auVar80,auVar80);
                      if ((auVar80 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar41[uVar39 * 4 + 0xfffffffffffffff0] = sVar13;
                      }
                      auVar80 = (auVar47 | _DAT_0023bc80) ^ auVar123;
                      iVar157 = -(uint)(iVar18 < auVar80._0_4_);
                      auVar83._4_4_ = -(uint)(iVar20 < auVar80._4_4_);
                      iVar38 = -(uint)(iVar22 < auVar80._8_4_);
                      auVar83._12_4_ = -(uint)(iVar153 < auVar80._12_4_);
                      auVar105._4_4_ = iVar157;
                      auVar105._0_4_ = iVar157;
                      auVar105._8_4_ = iVar38;
                      auVar105._12_4_ = iVar38;
                      auVar76 = pshuflw(auVar76,auVar105,0xe8);
                      auVar82._4_4_ = -(uint)(auVar80._4_4_ == iVar20);
                      auVar82._12_4_ = -(uint)(auVar80._12_4_ == iVar153);
                      auVar82._0_4_ = auVar82._4_4_;
                      auVar82._8_4_ = auVar82._12_4_;
                      in_XMM6 = pshuflw(auVar127 & auVar55,auVar82,0xe8);
                      in_XMM6 = in_XMM6 & auVar76;
                      auVar83._0_4_ = auVar83._4_4_;
                      auVar83._8_4_ = auVar83._12_4_;
                      auVar55 = pshuflw(auVar76,auVar83,0xe8);
                      auVar55 = (auVar55 | in_XMM6) ^ auVar129;
                      in_XMM5 = packssdw(auVar55,auVar55);
                      if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar41[uVar39 * 4 + 0xfffffffffffffff4] = sVar13;
                      }
                      auVar83 = auVar82 & auVar105 | auVar83;
                      auVar55 = packssdw(auVar83,auVar83);
                      auVar55 = packssdw(auVar55 ^ auVar129,auVar55 ^ auVar129);
                      if ((auVar55 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        psVar41[uVar39 * 4 + 0xfffffffffffffff8] = sVar13;
                      }
                      auVar55 = (auVar47 | _DAT_0023bc70) ^ auVar123;
                      auVar106._0_4_ = -(uint)(iVar18 < auVar55._0_4_);
                      auVar106._4_4_ = -(uint)(iVar20 < auVar55._4_4_);
                      auVar106._8_4_ = -(uint)(iVar22 < auVar55._8_4_);
                      auVar106._12_4_ = -(uint)(iVar153 < auVar55._12_4_);
                      auVar84._4_4_ = auVar106._0_4_;
                      auVar84._0_4_ = auVar106._0_4_;
                      auVar84._8_4_ = auVar106._8_4_;
                      auVar84._12_4_ = auVar106._8_4_;
                      auVar48._4_4_ = -(uint)(auVar55._4_4_ == iVar20);
                      auVar48._12_4_ = -(uint)(auVar55._12_4_ == iVar153);
                      auVar48._0_4_ = auVar48._4_4_;
                      auVar48._8_4_ = auVar48._12_4_;
                      auVar56._4_4_ = auVar106._4_4_;
                      auVar56._0_4_ = auVar106._4_4_;
                      auVar56._8_4_ = auVar106._12_4_;
                      auVar56._12_4_ = auVar106._12_4_;
                      auVar55 = packssdw(auVar106,auVar48 & auVar84 | auVar56);
                      auVar55 = packssdw(auVar55 ^ auVar129,auVar55 ^ auVar129);
                      if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar41[uVar39 * 4 + 0xfffffffffffffffc] = sVar13;
                      }
                      auVar127 = pshufhw(auVar84,auVar84,0x84);
                      auVar55 = pshufhw(auVar48,auVar48,0x84);
                      auVar76 = pshufhw(auVar56,auVar56,0x84);
                      auVar55 = packssdw(auVar55 & auVar127,
                                         (auVar76 | auVar55 & auVar127) ^ auVar129);
                      if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar41[uVar39 * 4] = sVar13;
                      }
                      uVar39 = uVar39 + 8;
                    } while (((ulong)uVar17 + 7 & 0xfffffffffffffff8) != uVar39);
                  }
                }
                else if (0 < iVar19) {
                  cVar12 = -(uVar35 == 3);
                  uVar39 = 0;
                  do {
                    auVar55._8_4_ = (int)uVar39;
                    auVar55._0_8_ = uVar39;
                    auVar55._12_4_ = (int)(uVar39 >> 0x20);
                    auVar76 = auVar46 ^ auVar123;
                    auVar127 = (auVar55 | _DAT_0023bb90) ^ auVar123;
                    iVar18 = auVar76._0_4_;
                    iVar157 = -(uint)(iVar18 < auVar127._0_4_);
                    iVar20 = auVar76._4_4_;
                    auVar80._4_4_ = -(uint)(iVar20 < auVar127._4_4_);
                    iVar22 = auVar76._8_4_;
                    iVar38 = -(uint)(iVar22 < auVar127._8_4_);
                    iVar153 = auVar76._12_4_;
                    auVar80._12_4_ = -(uint)(iVar153 < auVar127._12_4_);
                    auVar107._4_4_ = iVar157;
                    auVar107._0_4_ = iVar157;
                    auVar107._8_4_ = iVar38;
                    auVar107._12_4_ = iVar38;
                    auVar81 = pshuflw(in_XMM5,auVar107,0xe8);
                    auVar76._4_4_ = -(uint)(auVar127._4_4_ == iVar20);
                    auVar76._12_4_ = -(uint)(auVar127._12_4_ == iVar153);
                    auVar76._0_4_ = auVar76._4_4_;
                    auVar76._8_4_ = auVar76._12_4_;
                    auVar53 = pshuflw(in_XMM6,auVar76,0xe8);
                    auVar80._0_4_ = auVar80._4_4_;
                    auVar80._8_4_ = auVar80._12_4_;
                    auVar127 = pshuflw(auVar81,auVar80,0xe8);
                    auVar127 = (auVar127 | auVar53 & auVar81) ^ auVar129;
                    auVar127 = packssdw(auVar127,auVar127);
                    if ((auVar127 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffe2) = cVar12;
                    }
                    auVar80 = auVar76 & auVar107 | auVar80;
                    auVar76 = packssdw(auVar80,auVar80);
                    auVar76 = packssdw(auVar76 ^ auVar129,auVar76 ^ auVar129);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffe4) = cVar12;
                    }
                    auVar76 = (auVar55 | _DAT_0023bc90) ^ auVar123;
                    iVar157 = -(uint)(iVar18 < auVar76._0_4_);
                    auVar120._4_4_ = -(uint)(iVar20 < auVar76._4_4_);
                    iVar38 = -(uint)(iVar22 < auVar76._8_4_);
                    auVar120._12_4_ = -(uint)(iVar153 < auVar76._12_4_);
                    auVar127._4_4_ = iVar157;
                    auVar127._0_4_ = iVar157;
                    auVar127._8_4_ = iVar38;
                    auVar127._12_4_ = iVar38;
                    auVar108._4_4_ = -(uint)(auVar76._4_4_ == iVar20);
                    auVar108._12_4_ = -(uint)(auVar76._12_4_ == iVar153);
                    auVar108._0_4_ = auVar108._4_4_;
                    auVar108._8_4_ = auVar108._12_4_;
                    auVar120._0_4_ = auVar120._4_4_;
                    auVar120._8_4_ = auVar120._12_4_;
                    auVar76 = auVar108 & auVar127 | auVar120;
                    auVar76 = packssdw(auVar76,auVar76);
                    auVar76 = packssdw(auVar76 ^ auVar129,auVar76 ^ auVar129);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffe6) = cVar12;
                    }
                    auVar127 = pshufhw(auVar127,auVar127,0x84);
                    auVar132 = pshufhw(auVar108,auVar108,0x84);
                    auVar80 = pshufhw(auVar127,auVar120,0x84);
                    auVar127 = (auVar80 | auVar132 & auVar127) ^ auVar129;
                    auVar127 = packssdw(auVar127,auVar127);
                    auVar127 = packsswb(auVar127,auVar127);
                    if ((auVar127._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffe8) = cVar12;
                    }
                    auVar127 = (auVar55 | _DAT_0023bc80) ^ auVar123;
                    iVar157 = -(uint)(iVar18 < auVar127._0_4_);
                    auVar86._4_4_ = -(uint)(iVar20 < auVar127._4_4_);
                    iVar38 = -(uint)(iVar22 < auVar127._8_4_);
                    auVar86._12_4_ = -(uint)(iVar153 < auVar127._12_4_);
                    auVar109._4_4_ = iVar157;
                    auVar109._0_4_ = iVar157;
                    auVar109._8_4_ = iVar38;
                    auVar109._12_4_ = iVar38;
                    auVar76 = pshuflw(auVar76,auVar109,0xe8);
                    auVar85._4_4_ = -(uint)(auVar127._4_4_ == iVar20);
                    auVar85._12_4_ = -(uint)(auVar127._12_4_ == iVar153);
                    auVar85._0_4_ = auVar85._4_4_;
                    auVar85._8_4_ = auVar85._12_4_;
                    auVar80 = pshuflw(auVar53 & auVar81,auVar85,0xe8);
                    auVar86._0_4_ = auVar86._4_4_;
                    auVar86._8_4_ = auVar86._12_4_;
                    auVar127 = pshuflw(auVar76,auVar86,0xe8);
                    auVar127 = (auVar127 | auVar80 & auVar76) ^ auVar129;
                    auVar127 = packssdw(auVar127,auVar127);
                    auVar127 = packsswb(auVar127,auVar127);
                    if ((auVar127 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffea) = cVar12;
                    }
                    auVar86 = auVar85 & auVar109 | auVar86;
                    auVar127 = packssdw(auVar86,auVar86);
                    auVar127 = packssdw(auVar127 ^ auVar129,auVar127 ^ auVar129);
                    auVar127 = packsswb(auVar127,auVar127);
                    if ((auVar127._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffec) = cVar12;
                    }
                    auVar127 = (auVar55 | _DAT_0023bc70) ^ auVar123;
                    iVar157 = -(uint)(iVar18 < auVar127._0_4_);
                    auVar121._4_4_ = -(uint)(iVar20 < auVar127._4_4_);
                    iVar38 = -(uint)(iVar22 < auVar127._8_4_);
                    auVar121._12_4_ = -(uint)(iVar153 < auVar127._12_4_);
                    auVar87._4_4_ = iVar157;
                    auVar87._0_4_ = iVar157;
                    auVar87._8_4_ = iVar38;
                    auVar87._12_4_ = iVar38;
                    auVar110._4_4_ = -(uint)(auVar127._4_4_ == iVar20);
                    auVar110._12_4_ = -(uint)(auVar127._12_4_ == iVar153);
                    auVar110._0_4_ = auVar110._4_4_;
                    auVar110._8_4_ = auVar110._12_4_;
                    auVar121._0_4_ = auVar121._4_4_;
                    auVar121._8_4_ = auVar121._12_4_;
                    auVar127 = auVar110 & auVar87 | auVar121;
                    auVar127 = packssdw(auVar127,auVar127);
                    auVar127 = packssdw(auVar127 ^ auVar129,auVar127 ^ auVar129);
                    auVar127 = packsswb(auVar127,auVar127);
                    if ((auVar127 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffee) = cVar12;
                    }
                    auVar81 = pshufhw(auVar87,auVar87,0x84);
                    auVar132 = pshufhw(auVar110,auVar110,0x84);
                    auVar53 = pshufhw(auVar81,auVar121,0x84);
                    auVar81 = (auVar53 | auVar132 & auVar81) ^ auVar129;
                    auVar81 = packssdw(auVar81,auVar81);
                    auVar81 = packsswb(auVar81,auVar81);
                    if ((auVar81._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff0) = cVar12;
                    }
                    auVar81 = (auVar55 | _DAT_0023bc60) ^ auVar123;
                    iVar157 = -(uint)(iVar18 < auVar81._0_4_);
                    auVar89._4_4_ = -(uint)(iVar20 < auVar81._4_4_);
                    iVar38 = -(uint)(iVar22 < auVar81._8_4_);
                    auVar89._12_4_ = -(uint)(iVar153 < auVar81._12_4_);
                    auVar111._4_4_ = iVar157;
                    auVar111._0_4_ = iVar157;
                    auVar111._8_4_ = iVar38;
                    auVar111._12_4_ = iVar38;
                    auVar127 = pshuflw(auVar127,auVar111,0xe8);
                    auVar88._4_4_ = -(uint)(auVar81._4_4_ == iVar20);
                    auVar88._12_4_ = -(uint)(auVar81._12_4_ == iVar153);
                    auVar88._0_4_ = auVar88._4_4_;
                    auVar88._8_4_ = auVar88._12_4_;
                    auVar80 = pshuflw(auVar80 & auVar76,auVar88,0xe8);
                    auVar89._0_4_ = auVar89._4_4_;
                    auVar89._8_4_ = auVar89._12_4_;
                    auVar76 = pshuflw(auVar127,auVar89,0xe8);
                    auVar76 = (auVar76 | auVar80 & auVar127) ^ auVar129;
                    auVar76 = packssdw(auVar76,auVar76);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff2) = cVar12;
                    }
                    auVar89 = auVar88 & auVar111 | auVar89;
                    auVar76 = packssdw(auVar89,auVar89);
                    auVar76 = packssdw(auVar76 ^ auVar129,auVar76 ^ auVar129);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff4) = cVar12;
                    }
                    auVar76 = (auVar55 | _DAT_0023bc50) ^ auVar123;
                    iVar157 = -(uint)(iVar18 < auVar76._0_4_);
                    auVar122._4_4_ = -(uint)(iVar20 < auVar76._4_4_);
                    iVar38 = -(uint)(iVar22 < auVar76._8_4_);
                    auVar122._12_4_ = -(uint)(iVar153 < auVar76._12_4_);
                    auVar90._4_4_ = iVar157;
                    auVar90._0_4_ = iVar157;
                    auVar90._8_4_ = iVar38;
                    auVar90._12_4_ = iVar38;
                    auVar112._4_4_ = -(uint)(auVar76._4_4_ == iVar20);
                    auVar112._12_4_ = -(uint)(auVar76._12_4_ == iVar153);
                    auVar112._0_4_ = auVar112._4_4_;
                    auVar112._8_4_ = auVar112._12_4_;
                    auVar122._0_4_ = auVar122._4_4_;
                    auVar122._8_4_ = auVar122._12_4_;
                    auVar76 = auVar112 & auVar90 | auVar122;
                    auVar76 = packssdw(auVar76,auVar76);
                    auVar76 = packssdw(auVar76 ^ auVar129,auVar76 ^ auVar129);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff6) = cVar12;
                    }
                    auVar81 = pshufhw(auVar90,auVar90,0x84);
                    auVar132 = pshufhw(auVar112,auVar112,0x84);
                    auVar53 = pshufhw(auVar81,auVar122,0x84);
                    auVar81 = (auVar53 | auVar132 & auVar81) ^ auVar129;
                    auVar81 = packssdw(auVar81,auVar81);
                    auVar81 = packsswb(auVar81,auVar81);
                    if ((auVar81._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff8) = cVar12;
                    }
                    auVar81 = (auVar55 | _DAT_0023bc40) ^ auVar123;
                    iVar157 = -(uint)(iVar18 < auVar81._0_4_);
                    auVar92._4_4_ = -(uint)(iVar20 < auVar81._4_4_);
                    iVar38 = -(uint)(iVar22 < auVar81._8_4_);
                    auVar92._12_4_ = -(uint)(iVar153 < auVar81._12_4_);
                    auVar113._4_4_ = iVar157;
                    auVar113._0_4_ = iVar157;
                    auVar113._8_4_ = iVar38;
                    auVar113._12_4_ = iVar38;
                    auVar76 = pshuflw(auVar76,auVar113,0xe8);
                    auVar91._4_4_ = -(uint)(auVar81._4_4_ == iVar20);
                    auVar91._12_4_ = -(uint)(auVar81._12_4_ == iVar153);
                    auVar91._0_4_ = auVar91._4_4_;
                    auVar91._8_4_ = auVar91._12_4_;
                    in_XMM6 = pshuflw(auVar80 & auVar127,auVar91,0xe8);
                    in_XMM6 = in_XMM6 & auVar76;
                    auVar92._0_4_ = auVar92._4_4_;
                    auVar92._8_4_ = auVar92._12_4_;
                    auVar76 = pshuflw(auVar76,auVar92,0xe8);
                    auVar76 = (auVar76 | in_XMM6) ^ auVar129;
                    auVar76 = packssdw(auVar76,auVar76);
                    in_XMM5 = packsswb(auVar76,auVar76);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffffa) = cVar12;
                    }
                    auVar92 = auVar91 & auVar113 | auVar92;
                    auVar76 = packssdw(auVar92,auVar92);
                    auVar76 = packssdw(auVar76 ^ auVar129,auVar76 ^ auVar129);
                    auVar76 = packsswb(auVar76,auVar76);
                    if ((auVar76._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffffc) = cVar12;
                    }
                    auVar55 = (auVar55 | _DAT_0023bc30) ^ auVar123;
                    auVar114._0_4_ = -(uint)(iVar18 < auVar55._0_4_);
                    auVar114._4_4_ = -(uint)(iVar20 < auVar55._4_4_);
                    auVar114._8_4_ = -(uint)(iVar22 < auVar55._8_4_);
                    auVar114._12_4_ = -(uint)(iVar153 < auVar55._12_4_);
                    auVar93._4_4_ = auVar114._0_4_;
                    auVar93._0_4_ = auVar114._0_4_;
                    auVar93._8_4_ = auVar114._8_4_;
                    auVar93._12_4_ = auVar114._8_4_;
                    auVar49._4_4_ = -(uint)(auVar55._4_4_ == iVar20);
                    auVar49._12_4_ = -(uint)(auVar55._12_4_ == iVar153);
                    auVar49._0_4_ = auVar49._4_4_;
                    auVar49._8_4_ = auVar49._12_4_;
                    auVar57._4_4_ = auVar114._4_4_;
                    auVar57._0_4_ = auVar114._4_4_;
                    auVar57._8_4_ = auVar114._12_4_;
                    auVar57._12_4_ = auVar114._12_4_;
                    auVar55 = packssdw(auVar114,auVar49 & auVar93 | auVar57);
                    auVar55 = packssdw(auVar55 ^ auVar129,auVar55 ^ auVar129);
                    auVar55 = packsswb(auVar55,auVar55);
                    if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffffe) = cVar12;
                    }
                    auVar127 = pshufhw(auVar93,auVar93,0x84);
                    auVar55 = pshufhw(auVar49,auVar49,0x84);
                    auVar76 = pshufhw(auVar57,auVar57,0x84);
                    auVar55 = packssdw(auVar55 & auVar127,(auVar76 | auVar55 & auVar127) ^ auVar129)
                    ;
                    auVar55 = packsswb(auVar55,auVar55);
                    if ((auVar55._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2) = cVar12;
                    }
                    uVar39 = uVar39 + 0x10;
                  } while (((ulong)uVar17 + 0xf & 0xfffffffffffffff0) != uVar39);
                }
                uVar35 = uVar35 + 1;
                psVar40 = (stbi__uint16 *)((long)psVar40 + 1);
                psVar41 = psVar41 + 1;
                local_8990 = (stbi__uint16 *)((long)local_8990 + 1);
                local_8938 = local_8938 + 1;
              } while (uVar35 != 4);
            }
            else {
              stbi__skip(s,uVar15 * uVar31 * 2);
              lVar33 = (ulong)((uVar36 | uVar21) * (uVar34 | uVar24)) - 1;
              auVar128._8_4_ = (int)lVar33;
              auVar128._0_8_ = lVar33;
              auVar128._12_4_ = (int)((ulong)lVar33 >> 0x20);
              psVar40 = psVar27 + 0x1e;
              uVar35 = 0;
              auVar123 = _DAT_0023bc30;
              auVar46 = _DAT_0023bc40;
              auVar129 = _DAT_0023bc50;
              auVar55 = _DAT_0023bc60;
              auVar76 = _DAT_0023bc70;
              auVar127 = _DAT_0023bc80;
              auVar80 = _DAT_0023bc90;
              auVar81 = _DAT_0023bb90;
              do {
                if (uVar35 < uVar15) {
                  iVar14 = stbi__psd_decode_rle(s,(stbi_uc *)((long)psVar27 + uVar35),iVar19);
                  auVar123 = _DAT_0023bc30;
                  auVar46 = _DAT_0023bc40;
                  auVar129 = _DAT_0023bc50;
                  auVar55 = _DAT_0023bc60;
                  auVar76 = _DAT_0023bc70;
                  auVar127 = _DAT_0023bc80;
                  auVar80 = _DAT_0023bc90;
                  auVar81 = _DAT_0023bb90;
                  if (iVar14 == 0) {
                    free(psVar27);
                    lVar33 = *in_FS_OFFSET;
                    pcVar32 = "corrupt";
                    goto LAB_00138cad;
                  }
                }
                else if (0 < iVar19) {
                  cVar12 = -(uVar35 == 3);
                  uVar39 = 0;
                  do {
                    auVar44._8_4_ = (int)uVar39;
                    auVar44._0_8_ = uVar39;
                    auVar44._12_4_ = (int)(uVar39 >> 0x20);
                    auVar53 = auVar128 ^ _DAT_0023bba0;
                    auVar132 = (auVar44 | auVar81) ^ _DAT_0023bba0;
                    iVar14 = auVar53._0_4_;
                    iVar153 = -(uint)(iVar14 < auVar132._0_4_);
                    iVar18 = auVar53._4_4_;
                    auVar65._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
                    iVar20 = auVar53._8_4_;
                    iVar157 = -(uint)(iVar20 < auVar132._8_4_);
                    iVar22 = auVar53._12_4_;
                    auVar65._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
                    auVar95._4_4_ = iVar153;
                    auVar95._0_4_ = iVar153;
                    auVar95._8_4_ = iVar157;
                    auVar95._12_4_ = iVar157;
                    auVar53 = pshuflw(in_XMM5,auVar95,0xe8);
                    auVar64._4_4_ = -(uint)(auVar132._4_4_ == iVar18);
                    auVar64._12_4_ = -(uint)(auVar132._12_4_ == iVar22);
                    auVar64._0_4_ = auVar64._4_4_;
                    auVar64._8_4_ = auVar64._12_4_;
                    auVar134 = pshuflw(in_XMM6,auVar64,0xe8);
                    auVar65._0_4_ = auVar65._4_4_;
                    auVar65._8_4_ = auVar65._12_4_;
                    auVar132 = pshuflw(auVar53,auVar65,0xe8);
                    auVar124._8_4_ = 0xffffffff;
                    auVar124._0_8_ = 0xffffffffffffffff;
                    auVar124._12_4_ = 0xffffffff;
                    auVar53 = (auVar132 | auVar134 & auVar53) ^ auVar124;
                    auVar53 = packssdw(auVar53,auVar53);
                    if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffe2) = cVar12;
                    }
                    auVar65 = auVar64 & auVar95 | auVar65;
                    auVar53 = packssdw(auVar65,auVar65);
                    auVar53 = packssdw(auVar53 ^ auVar124,auVar53 ^ auVar124);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffe4) = cVar12;
                    }
                    auVar53 = (auVar44 | auVar80) ^ _DAT_0023bba0;
                    iVar153 = -(uint)(iVar14 < auVar53._0_4_);
                    auVar116._4_4_ = -(uint)(iVar18 < auVar53._4_4_);
                    iVar157 = -(uint)(iVar20 < auVar53._8_4_);
                    auVar116._12_4_ = -(uint)(iVar22 < auVar53._12_4_);
                    auVar66._4_4_ = iVar153;
                    auVar66._0_4_ = iVar153;
                    auVar66._8_4_ = iVar157;
                    auVar66._12_4_ = iVar157;
                    auVar96._4_4_ = -(uint)(auVar53._4_4_ == iVar18);
                    auVar96._12_4_ = -(uint)(auVar53._12_4_ == iVar22);
                    auVar96._0_4_ = auVar96._4_4_;
                    auVar96._8_4_ = auVar96._12_4_;
                    auVar116._0_4_ = auVar116._4_4_;
                    auVar116._8_4_ = auVar116._12_4_;
                    auVar53 = auVar96 & auVar66 | auVar116;
                    auVar53 = packssdw(auVar53,auVar53);
                    auVar53 = packssdw(auVar53 ^ auVar124,auVar53 ^ auVar124);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffe6) = cVar12;
                    }
                    auVar132 = pshufhw(auVar66,auVar66,0x84);
                    auVar58 = pshufhw(auVar96,auVar96,0x84);
                    auVar134 = pshufhw(auVar132,auVar116,0x84);
                    auVar132 = (auVar134 | auVar58 & auVar132) ^ auVar124;
                    auVar132 = packssdw(auVar132,auVar132);
                    auVar132 = packsswb(auVar132,auVar132);
                    if ((auVar132._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffe8) = cVar12;
                    }
                    auVar132 = (auVar44 | auVar127) ^ _DAT_0023bba0;
                    iVar153 = -(uint)(iVar14 < auVar132._0_4_);
                    auVar68._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
                    iVar157 = -(uint)(iVar20 < auVar132._8_4_);
                    auVar68._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
                    auVar97._4_4_ = iVar153;
                    auVar97._0_4_ = iVar153;
                    auVar97._8_4_ = iVar157;
                    auVar97._12_4_ = iVar157;
                    auVar53 = pshuflw(auVar53,auVar97,0xe8);
                    auVar67._4_4_ = -(uint)(auVar132._4_4_ == iVar18);
                    auVar67._12_4_ = -(uint)(auVar132._12_4_ == iVar22);
                    auVar67._0_4_ = auVar67._4_4_;
                    auVar67._8_4_ = auVar67._12_4_;
                    auVar134 = pshuflw(auVar124,auVar67,0xe8);
                    auVar68._0_4_ = auVar68._4_4_;
                    auVar68._8_4_ = auVar68._12_4_;
                    auVar132 = pshuflw(auVar53,auVar68,0xe8);
                    auVar125._8_4_ = 0xffffffff;
                    auVar125._0_8_ = 0xffffffffffffffff;
                    auVar125._12_4_ = 0xffffffff;
                    auVar53 = (auVar132 | auVar134 & auVar53) ^ auVar125;
                    auVar53 = packssdw(auVar53,auVar53);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffea) = cVar12;
                    }
                    auVar68 = auVar67 & auVar97 | auVar68;
                    auVar53 = packssdw(auVar68,auVar68);
                    auVar53 = packssdw(auVar53 ^ auVar125,auVar53 ^ auVar125);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffec) = cVar12;
                    }
                    auVar53 = (auVar44 | auVar76) ^ _DAT_0023bba0;
                    iVar153 = -(uint)(iVar14 < auVar53._0_4_);
                    auVar117._4_4_ = -(uint)(iVar18 < auVar53._4_4_);
                    iVar157 = -(uint)(iVar20 < auVar53._8_4_);
                    auVar117._12_4_ = -(uint)(iVar22 < auVar53._12_4_);
                    auVar69._4_4_ = iVar153;
                    auVar69._0_4_ = iVar153;
                    auVar69._8_4_ = iVar157;
                    auVar69._12_4_ = iVar157;
                    auVar98._4_4_ = -(uint)(auVar53._4_4_ == iVar18);
                    auVar98._12_4_ = -(uint)(auVar53._12_4_ == iVar22);
                    auVar98._0_4_ = auVar98._4_4_;
                    auVar98._8_4_ = auVar98._12_4_;
                    auVar117._0_4_ = auVar117._4_4_;
                    auVar117._8_4_ = auVar117._12_4_;
                    auVar53 = auVar98 & auVar69 | auVar117;
                    auVar53 = packssdw(auVar53,auVar53);
                    auVar53 = packssdw(auVar53 ^ auVar125,auVar53 ^ auVar125);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xffffffffffffffee) = cVar12;
                    }
                    auVar132 = pshufhw(auVar69,auVar69,0x84);
                    auVar58 = pshufhw(auVar98,auVar98,0x84);
                    auVar134 = pshufhw(auVar132,auVar117,0x84);
                    auVar132 = (auVar134 | auVar58 & auVar132) ^ auVar125;
                    auVar132 = packssdw(auVar132,auVar132);
                    auVar132 = packsswb(auVar132,auVar132);
                    if ((auVar132._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff0) = cVar12;
                    }
                    auVar132 = (auVar44 | auVar55) ^ _DAT_0023bba0;
                    iVar153 = -(uint)(iVar14 < auVar132._0_4_);
                    auVar71._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
                    iVar157 = -(uint)(iVar20 < auVar132._8_4_);
                    auVar71._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
                    auVar99._4_4_ = iVar153;
                    auVar99._0_4_ = iVar153;
                    auVar99._8_4_ = iVar157;
                    auVar99._12_4_ = iVar157;
                    auVar53 = pshuflw(auVar53,auVar99,0xe8);
                    auVar70._4_4_ = -(uint)(auVar132._4_4_ == iVar18);
                    auVar70._12_4_ = -(uint)(auVar132._12_4_ == iVar22);
                    auVar70._0_4_ = auVar70._4_4_;
                    auVar70._8_4_ = auVar70._12_4_;
                    auVar134 = pshuflw(auVar125,auVar70,0xe8);
                    auVar71._0_4_ = auVar71._4_4_;
                    auVar71._8_4_ = auVar71._12_4_;
                    auVar132 = pshuflw(auVar53,auVar71,0xe8);
                    auVar126._8_4_ = 0xffffffff;
                    auVar126._0_8_ = 0xffffffffffffffff;
                    auVar126._12_4_ = 0xffffffff;
                    auVar53 = (auVar132 | auVar134 & auVar53) ^ auVar126;
                    auVar53 = packssdw(auVar53,auVar53);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff2) = cVar12;
                    }
                    auVar71 = auVar70 & auVar99 | auVar71;
                    auVar53 = packssdw(auVar71,auVar71);
                    auVar53 = packssdw(auVar53 ^ auVar126,auVar53 ^ auVar126);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff4) = cVar12;
                    }
                    auVar53 = (auVar44 | auVar129) ^ _DAT_0023bba0;
                    iVar153 = -(uint)(iVar14 < auVar53._0_4_);
                    auVar118._4_4_ = -(uint)(iVar18 < auVar53._4_4_);
                    iVar157 = -(uint)(iVar20 < auVar53._8_4_);
                    auVar118._12_4_ = -(uint)(iVar22 < auVar53._12_4_);
                    auVar72._4_4_ = iVar153;
                    auVar72._0_4_ = iVar153;
                    auVar72._8_4_ = iVar157;
                    auVar72._12_4_ = iVar157;
                    auVar100._4_4_ = -(uint)(auVar53._4_4_ == iVar18);
                    auVar100._12_4_ = -(uint)(auVar53._12_4_ == iVar22);
                    auVar100._0_4_ = auVar100._4_4_;
                    auVar100._8_4_ = auVar100._12_4_;
                    auVar118._0_4_ = auVar118._4_4_;
                    auVar118._8_4_ = auVar118._12_4_;
                    auVar53 = auVar100 & auVar72 | auVar118;
                    auVar53 = packssdw(auVar53,auVar53);
                    auVar53 = packssdw(auVar53 ^ auVar126,auVar53 ^ auVar126);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff6) = cVar12;
                    }
                    auVar132 = pshufhw(auVar72,auVar72,0x84);
                    auVar58 = pshufhw(auVar100,auVar100,0x84);
                    auVar134 = pshufhw(auVar132,auVar118,0x84);
                    auVar132 = (auVar134 | auVar58 & auVar132) ^ auVar126;
                    auVar132 = packssdw(auVar132,auVar132);
                    auVar132 = packsswb(auVar132,auVar132);
                    if ((auVar132._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffff8) = cVar12;
                    }
                    auVar132 = (auVar44 | auVar46) ^ _DAT_0023bba0;
                    iVar153 = -(uint)(iVar14 < auVar132._0_4_);
                    auVar74._4_4_ = -(uint)(iVar18 < auVar132._4_4_);
                    iVar157 = -(uint)(iVar20 < auVar132._8_4_);
                    auVar74._12_4_ = -(uint)(iVar22 < auVar132._12_4_);
                    auVar101._4_4_ = iVar153;
                    auVar101._0_4_ = iVar153;
                    auVar101._8_4_ = iVar157;
                    auVar101._12_4_ = iVar157;
                    auVar53 = pshuflw(auVar53,auVar101,0xe8);
                    auVar73._4_4_ = -(uint)(auVar132._4_4_ == iVar18);
                    auVar73._12_4_ = -(uint)(auVar132._12_4_ == iVar22);
                    auVar73._0_4_ = auVar73._4_4_;
                    auVar73._8_4_ = auVar73._12_4_;
                    auVar134 = pshuflw(auVar126,auVar73,0xe8);
                    auVar74._0_4_ = auVar74._4_4_;
                    auVar74._8_4_ = auVar74._12_4_;
                    auVar132 = pshuflw(auVar53,auVar74,0xe8);
                    in_XMM6._8_4_ = 0xffffffff;
                    in_XMM6._0_8_ = 0xffffffffffffffff;
                    in_XMM6._12_4_ = 0xffffffff;
                    auVar53 = (auVar132 | auVar134 & auVar53) ^ in_XMM6;
                    auVar53 = packssdw(auVar53,auVar53);
                    in_XMM5 = packsswb(auVar53,auVar53);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffffa) = cVar12;
                    }
                    auVar74 = auVar73 & auVar101 | auVar74;
                    auVar53 = packssdw(auVar74,auVar74);
                    auVar53 = packssdw(auVar53 ^ in_XMM6,auVar53 ^ in_XMM6);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffffc) = cVar12;
                    }
                    auVar53 = (auVar44 | auVar123) ^ _DAT_0023bba0;
                    auVar102._0_4_ = -(uint)(iVar14 < auVar53._0_4_);
                    auVar102._4_4_ = -(uint)(iVar18 < auVar53._4_4_);
                    auVar102._8_4_ = -(uint)(iVar20 < auVar53._8_4_);
                    auVar102._12_4_ = -(uint)(iVar22 < auVar53._12_4_);
                    auVar75._4_4_ = auVar102._0_4_;
                    auVar75._0_4_ = auVar102._0_4_;
                    auVar75._8_4_ = auVar102._8_4_;
                    auVar75._12_4_ = auVar102._8_4_;
                    auVar45._4_4_ = -(uint)(auVar53._4_4_ == iVar18);
                    auVar45._12_4_ = -(uint)(auVar53._12_4_ == iVar22);
                    auVar45._0_4_ = auVar45._4_4_;
                    auVar45._8_4_ = auVar45._12_4_;
                    auVar54._4_4_ = auVar102._4_4_;
                    auVar54._0_4_ = auVar102._4_4_;
                    auVar54._8_4_ = auVar102._12_4_;
                    auVar54._12_4_ = auVar102._12_4_;
                    auVar53 = packssdw(auVar102,auVar45 & auVar75 | auVar54);
                    auVar53 = packssdw(auVar53 ^ in_XMM6,auVar53 ^ in_XMM6);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar39 * 2 + 0xfffffffffffffffe) = cVar12;
                    }
                    auVar134 = pshufhw(auVar75,auVar75,0x84);
                    auVar53 = pshufhw(auVar45,auVar45,0x84);
                    auVar132 = pshufhw(auVar54,auVar54,0x84);
                    auVar53 = packssdw(auVar53 & auVar134,(auVar132 | auVar53 & auVar134) ^ in_XMM6)
                    ;
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar39 * 2) = cVar12;
                    }
                    uVar39 = uVar39 + 0x10;
                  } while (((ulong)((uVar36 + uVar21) * (uVar34 + uVar24)) + 0xf &
                           0xfffffffffffffff0) != uVar39);
                }
                uVar35 = uVar35 + 1;
                psVar40 = (stbi__uint16 *)((long)psVar40 + 1);
              } while (uVar35 != 4);
            }
            if (3 < uVar15) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar19) {
                  uVar35 = 0;
                  do {
                    uVar2 = psVar27[uVar35 * 4 + 3];
                    if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                      fVar115 = 1.0 / ((float)uVar2 / 65535.0);
                      fVar94 = (1.0 - fVar115) * 65535.0;
                      auVar123._0_4_ =
                           (int)(fVar94 + fVar115 * (float)(*(uint *)(psVar27 + uVar35 * 4) & 0xffff
                                                           ));
                      auVar123._4_4_ =
                           (int)(fVar94 + fVar115 * (float)(*(uint *)(psVar27 + uVar35 * 4) >> 0x10)
                                );
                      auVar123._8_4_ = (int)(fVar94 + fVar115 * 0.0);
                      auVar123._12_4_ = (int)(fVar94 + fVar115 * 0.0);
                      auVar123 = pshuflw(auVar123,auVar123,0xe8);
                      *(int *)(psVar27 + uVar35 * 4) = auVar123._0_4_;
                      psVar27[uVar35 * 4 + 2] =
                           (stbi__uint16)(int)((float)psVar27[uVar35 * 4 + 2] * fVar115 + fVar94);
                    }
                    uVar35 = uVar35 + 1;
                  } while ((uVar36 + uVar21) * (uVar34 + uVar24) != uVar35);
                }
              }
              else if (0 < iVar19) {
                uVar35 = 0;
                do {
                  bVar10 = *(byte *)((long)psVar27 + uVar35 * 4 + 3);
                  if ((bVar10 != 0) && (bVar10 != 0xff)) {
                    fVar115 = 1.0 / ((float)bVar10 / 255.0);
                    fVar94 = (1.0 - fVar115) * 255.0;
                    *(char *)(psVar27 + uVar35 * 2) =
                         (char)(int)((float)(byte)psVar27[uVar35 * 2] * fVar115 + fVar94);
                    *(char *)((long)psVar27 + uVar35 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)psVar27 + uVar35 * 4 + 1) * fVar115 +
                                    fVar94);
                    *(char *)(psVar27 + uVar35 * 2 + 1) =
                         (char)(int)((float)(byte)psVar27[uVar35 * 2 + 1] * fVar115 + fVar94);
                  }
                  uVar35 = uVar35 + 1;
                } while ((uVar36 + uVar21) * (uVar34 + uVar24) != uVar35);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                psVar27 = stbi__convert_format16(psVar27,4,req_comp,uVar23,uVar31);
              }
              else {
                psVar27 = (stbi__uint16 *)
                          stbi__convert_format((uchar *)psVar27,4,req_comp,uVar23,uVar31);
              }
              if (psVar27 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = uVar31;
            *x = uVar23;
            return psVar27;
          }
          goto LAB_0013accd;
        }
      }
    }
  }
LAB_00139958:
  lVar33 = *in_FS_OFFSET;
  pcVar32 = "too large";
LAB_00138cad:
  *(char **)(lVar33 + -0x20) = pcVar32;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}